

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void inputText(_GLFWwindow *window,uint32_t scancode)

{
  int iVar1;
  xkb_keysym_t keysym_00;
  uint32_t uVar2;
  int in_ESI;
  int plain;
  int mods;
  uint32_t codepoint;
  xkb_keysym_t keysym;
  xkb_keycode_t keycode;
  xkb_keysym_t *keysyms;
  int in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  xkb_keysym_t in_stack_ffffffffffffffd0;
  xkb_keysym_t *local_18 [3];
  
  iVar1 = (*_glfw.wl.xkb.state_key_get_syms)(_glfw.wl.xkb.state,in_ESI + 8,local_18);
  if (iVar1 == 1) {
    keysym_00 = composeSymbol(in_stack_ffffffffffffffd0);
    uVar2 = _glfwKeySym2Unicode(keysym_00);
    if (uVar2 != 0xffffffff) {
      _glfwInputChar((_GLFWwindow *)
                     (ulong)((CONCAT14((_glfw.wl.xkb.modifiers & 6) != 0,in_stack_ffffffffffffffd0)
                             ^ 0xff00000000) & 0x1ffffffff),in_stack_ffffffffffffffcc,
                     in_stack_ffffffffffffffc8,0);
    }
  }
  return;
}

Assistant:

static void inputText(_GLFWwindow* window, uint32_t scancode)
{
    const xkb_keysym_t* keysyms;
    const xkb_keycode_t keycode = scancode + 8;

    if (xkb_state_key_get_syms(_glfw.wl.xkb.state, keycode, &keysyms) == 1)
    {
        const xkb_keysym_t keysym = composeSymbol(keysyms[0]);
        const uint32_t codepoint = _glfwKeySym2Unicode(keysym);
        if (codepoint != GLFW_INVALID_CODEPOINT)
        {
            const int mods = _glfw.wl.xkb.modifiers;
            const int plain = !(mods & (GLFW_MOD_CONTROL | GLFW_MOD_ALT));
            _glfwInputChar(window, codepoint, mods, plain);
        }
    }
}